

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O3

void R_RenderFakeWall(drawseg_t *ds,int x1,int x2,F3DFloor *rover)

{
  undefined4 uVar1;
  undefined4 uVar2;
  side_t *psVar3;
  double dVar4;
  double yrepeat;
  undefined1 auVar5 [16];
  short *psVar6;
  short *psVar7;
  ESPSResult EVar8;
  long lVar9;
  side_t **ppsVar10;
  lighttable_t *plVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  double dVar15;
  
  auVar5 = SEXT816((long)rover->alpha << 0x10) * ZEXT816(0x8080808080808081);
  EVar8 = R_SetPatchStyle(LegacyRenderStyles[((rover->flags >> 0x1c & 1) != 0) + 6],
                          (int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f),0,0);
  if (EVar8 == DontDraw) goto LAB_003104a3;
  rw_lightstep = ds->lightstep;
  lVar9 = (long)ds->x1;
  fVar14 = (float)(x1 - ds->x1);
  rw_light = rw_lightstep * fVar14 + ds->light;
  mfloorclip = openings + (ds->sprbottomclip - lVar9);
  mceilingclip = openings + (ds->sprtopclip - lVar9);
  spryscale = (double)(fVar14 * ds->iscalestep + ds->iscale);
  rw_scalestep = (double)ds->iscalestep;
  MaskedSWall = (float *)(openings + ds->swall + lVar9 * -2);
  if ((rover->flags >> 0x11 & 1) == 0) {
    if ((rover->flags >> 0x12 & 1) == 0) {
      ppsVar10 = rover->master->sidedef;
      iVar12 = 1;
    }
    else {
      ppsVar10 = &curline->sidedef;
      iVar12 = 2;
    }
  }
  else {
    ppsVar10 = &curline->sidedef;
    iVar12 = 0;
  }
  dVar15 = *(double *)((long)&(*ppsVar10)->textures[0].xScale + (ulong)(uint)(iVar12 * 0x30)) *
           (rw_pic->Scale).X;
  yrepeat = *(double *)((long)&(*ppsVar10)->textures[0].yScale + (ulong)(uint)(iVar12 * 0x30)) *
            (rw_pic->Scale).Y;
  psVar3 = rover->master->sidedef[0];
  dVar4 = psVar3->textures[1].yOffset + curline->sidedef->textures[1].yOffset;
  rw_offset = SUB84(curline->sidedef->textures[1].xOffset + 103079215104.0 +
                    psVar3->textures[1].xOffset,0);
  if (dVar4 < 0.0) {
    dVar4 = dVar4 + (double)rw_pic->Height;
  }
  if ((rw_pic->field_0x31 & 4) != 0) {
    dVar4 = dVar4 * yrepeat;
    rw_offset = SUB84((double)rw_offset * dVar15 + 6755399441055744.0,0);
  }
  dc_texturemid = (rover->model->planes[1].TexZ - ViewPos.Z) * yrepeat + dVar4;
  if ((long)fixedlightlev < 0) {
    plVar11 = fixedcolormap;
    if (fixedcolormap != (lighttable_t *)0x0) goto LAB_0031032b;
  }
  else {
    plVar11 = basecolormap->Maps + fixedlightlev;
LAB_0031032b:
    dc_colormap = plVar11;
  }
  WallC.sz1 = ds->sz1;
  WallC.sz2 = ds->sz2;
  WallC.sx1 = ds->sx1;
  WallC.sx2 = ds->sx2;
  WallC.tleft.X = ds->cx;
  WallC.tleft.Y = ds->cy;
  uVar1 = ds->cdx;
  uVar2 = ds->cdy;
  WallC.tright.X = (float)uVar1 + WallC.tleft.X;
  WallC.tright.Y = (float)uVar2 + WallC.tleft.Y;
  WallT.UoverZorg = (ds->tmapvals).UoverZorg;
  WallT.UoverZstep = (ds->tmapvals).UoverZstep;
  WallT.InvZorg = (ds->tmapvals).InvZorg;
  WallT.InvZstep = (ds->tmapvals).InvZstep;
  OWallMost(wallupper,sclipTop - ViewPos.Z,&WallC);
  OWallMost(walllower,sclipBottom - ViewPos.Z,&WallC);
  psVar7 = mceilingclip;
  if (x1 < x2) {
    lVar9 = (long)x1;
    lVar13 = 0;
    do {
      if (wallupper[lVar13 + lVar9] < psVar7[lVar9 + lVar13]) {
        wallupper[lVar9 + lVar13] = psVar7[lVar9 + lVar13];
      }
      psVar6 = mfloorclip;
      lVar13 = lVar13 + 1;
    } while (x2 - lVar9 != lVar13);
    if (x1 < x2) {
      lVar13 = 0;
      do {
        if (psVar6[lVar9 + lVar13] < walllower[lVar13 + lVar9]) {
          walllower[lVar9 + lVar13] = psVar6[lVar9 + lVar13];
        }
        lVar13 = lVar13 + 1;
      } while (x2 - lVar9 != lVar13);
    }
  }
  PrepLWall(lwall,dVar15 * (double)curline->sidedef->TexelLength,(int)ds->sx1,(int)ds->sx2);
  wallscan_np2_ds(ds,x1,x2,wallupper,walllower,MaskedSWall,lwall,yrepeat);
LAB_003104a3:
  R_FinishSetPatchStyle();
  return;
}

Assistant:

void R_RenderFakeWall(drawseg_t *ds, int x1, int x2, F3DFloor *rover)
{
	int i;
	double xscale;
	double yscale;

	fixed_t Alpha = Scale(rover->alpha, OPAQUE, 255);
	ESPSResult drawmode;
	drawmode = R_SetPatchStyle (LegacyRenderStyles[rover->flags & FF_ADDITIVETRANS ? STYLE_Add : STYLE_Translucent],
		Alpha, 0, 0);

	if(drawmode == DontDraw) {
		R_FinishSetPatchStyle();
		return;
	}

	rw_lightstep = ds->lightstep;
	rw_light = ds->light + (x1 - ds->x1) * rw_lightstep;

	mfloorclip = openings + ds->sprbottomclip - ds->x1;
	mceilingclip = openings + ds->sprtopclip - ds->x1;

	spryscale = ds->iscale + ds->iscalestep * (x1 - ds->x1);
	rw_scalestep = ds->iscalestep;
	MaskedSWall = (float *)(openings + ds->swall) - ds->x1;

	// find positioning
	side_t *scaledside;
	side_t::ETexpart scaledpart;
	if (rover->flags & FF_UPPERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::top;
	}
	else if (rover->flags & FF_LOWERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::bottom;
	}
	else
	{
		scaledside = rover->master->sidedef[0];
		scaledpart = side_t::mid;
	}
	xscale = rw_pic->Scale.X * scaledside->GetTextureXScale(scaledpart);
	yscale = rw_pic->Scale.Y * scaledside->GetTextureYScale(scaledpart);

	double rowoffset = curline->sidedef->GetTextureYOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureYOffset(side_t::mid);
	double planez = rover->model->GetPlaneTexZ(sector_t::ceiling);
	rw_offset = FLOAT2FIXED(curline->sidedef->GetTextureXOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureXOffset(side_t::mid));
	if (rowoffset < 0)
	{
		rowoffset += rw_pic->GetHeight();
	}
	dc_texturemid = (planez - ViewPos.Z) * yscale;
	if (rw_pic->bWorldPanning)
	{
		// rowoffset is added before the multiply so that the masked texture will
		// still be positioned in world units rather than texels.

		dc_texturemid = dc_texturemid + rowoffset * yscale;
		rw_offset = xs_RoundToInt(rw_offset * xscale);
	}
	else
	{
		// rowoffset is added outside the multiply so that it positions the texture
		// by texels instead of world units.
		dc_texturemid += rowoffset;
	}

	if (fixedlightlev >= 0)
		dc_colormap = basecolormap->Maps + fixedlightlev;
	else if (fixedcolormap != NULL)
		dc_colormap = fixedcolormap;

	WallC.sz1 = ds->sz1;
	WallC.sz2 = ds->sz2;
	WallC.sx1 = ds->sx1;
	WallC.sx2 = ds->sx2;
	WallC.tleft.X = ds->cx;
	WallC.tleft.Y = ds->cy;
	WallC.tright.X = ds->cx + ds->cdx;
	WallC.tright.Y = ds->cy + ds->cdy;
	WallT = ds->tmapvals;

	OWallMost(wallupper, sclipTop - ViewPos.Z, &WallC);
	OWallMost(walllower, sclipBottom - ViewPos.Z, &WallC);

	for (i = x1; i < x2; i++)
	{
		if (wallupper[i] < mceilingclip[i])
			wallupper[i] = mceilingclip[i];
	}
	for (i = x1; i < x2; i++)
	{
		if (walllower[i] > mfloorclip[i])
			walllower[i] = mfloorclip[i];
	}

	PrepLWall (lwall, curline->sidedef->TexelLength*xscale, ds->sx1, ds->sx2);
	wallscan_np2_ds(ds, x1, x2, wallupper, walllower, MaskedSWall, lwall, yscale);
	R_FinishSetPatchStyle();
}